

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_getmetatable(lua_State *L,int objindex)

{
  StkId pTVar1;
  TValue *pTVar2;
  TValue *i_o;
  GCObject *pGStack_28;
  int res;
  Table *mt;
  TValue *obj;
  int objindex_local;
  lua_State *L_local;
  
  pTVar2 = index2adr(L,objindex);
  if (pTVar2->tt == 5) {
    pGStack_28 = (GCObject *)(((pTVar2->value).gc)->h).metatable;
  }
  else if (pTVar2->tt == 7) {
    pGStack_28 = (GCObject *)(((pTVar2->value).gc)->h).metatable;
  }
  else {
    pGStack_28 = (GCObject *)L->l_G->mt[pTVar2->tt];
  }
  if (pGStack_28 != (GCObject *)0x0) {
    pTVar1 = L->top;
    (pTVar1->value).gc = pGStack_28;
    pTVar1->tt = 5;
    L->top = L->top + 1;
  }
  i_o._4_4_ = (uint)(pGStack_28 != (GCObject *)0x0);
  return i_o._4_4_;
}

Assistant:

static int lua_getmetatable(lua_State*L,int objindex){
const TValue*obj;
Table*mt=NULL;
int res;
obj=index2adr(L,objindex);
switch(ttype(obj)){
case 5:
mt=hvalue(obj)->metatable;
break;
case 7:
mt=uvalue(obj)->metatable;
break;
default:
mt=G(L)->mt[ttype(obj)];
break;
}
if(mt==NULL)
res=0;
else{
sethvalue(L,L->top,mt);
api_incr_top(L);
res=1;
}
return res;
}